

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution_x86.cpp
# Opt level: O1

int __thiscall
ncnn::Deconvolution_x86::forward(Deconvolution_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float *pfVar1;
  float *pfVar2;
  undefined4 uVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  size_t sVar7;
  void *pvVar8;
  size_t sVar9;
  Layer *pLVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  Mat *pMVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  uint uVar29;
  long lVar30;
  long lVar31;
  undefined4 *puVar32;
  int iVar33;
  uint uVar34;
  int iVar35;
  ulong uVar36;
  uint uVar37;
  int iVar38;
  ulong uVar39;
  float *pfVar40;
  int x;
  undefined4 *puVar41;
  int w_1;
  ulong uVar42;
  long lVar43;
  ulong uVar44;
  ulong uVar45;
  byte bVar46;
  uint uVar47;
  int iVar48;
  int iVar49;
  int y;
  undefined1 (*pauVar50) [16];
  int y_1;
  int iVar51;
  float *pfVar52;
  int w;
  int iVar53;
  ulong uVar54;
  int iVar55;
  void *pvVar56;
  void *pvVar57;
  void *pvVar58;
  undefined1 auVar59 [16];
  undefined1 extraout_var [12];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  float fVar62;
  float fVar65;
  v4sf one;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  float fVar66;
  float fVar74;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  float fVar75;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [12];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined4 uVar83;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  float fVar89;
  float fVar96;
  float fVar97;
  float fVar98;
  undefined1 auVar91 [16];
  float fVar90;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  int outh;
  int size;
  int h_1;
  int outh_1;
  int outw;
  Option opt_b;
  void *local_280;
  int local_274;
  long local_270;
  int local_260;
  float *local_228;
  ulong local_218;
  Mat local_1b8;
  void *local_168;
  void *local_160;
  undefined1 local_158 [16];
  Option *local_140;
  int local_134;
  void *local_130;
  Mat *local_128;
  long local_120;
  void *local_118;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined4 local_108;
  undefined4 uStack_104;
  undefined4 uStack_100;
  long *local_f8;
  undefined4 uStack_f0;
  int iStack_ec;
  undefined4 uStack_e8;
  undefined4 uStack_e4;
  undefined4 local_e0;
  undefined8 local_d8;
  void *local_c8;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  undefined4 local_b8;
  undefined4 uStack_b4;
  int local_b0;
  Allocator *local_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  int local_90;
  size_t local_88;
  long local_80;
  undefined8 local_78;
  Allocator *pAStack_70;
  Allocator *local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  iVar4 = bottom_blob->w;
  iVar5 = bottom_blob->h;
  uVar36 = bottom_blob->elemsize;
  local_160 = (void *)(long)bottom_blob->elempack;
  iVar23 = (this->super_Deconvolution).dilation_w;
  uVar47 = (this->super_Deconvolution).num_output;
  iVar33 = (this->super_Deconvolution).kernel_w;
  iVar35 = (this->super_Deconvolution).stride_w;
  local_134 = ((this->super_Deconvolution).kernel_h + -1) * (this->super_Deconvolution).dilation_h;
  iVar51 = (this->super_Deconvolution).stride_h;
  bVar46 = (uVar47 & 3) == 0 & opt->use_packing_layout;
  iVar55 = (this->super_Deconvolution).output_pad_right;
  iVar48 = (this->super_Deconvolution).output_pad_bottom;
  iVar49 = (uint)bVar46 + (uint)bVar46 * 2 + 1;
  uVar47 = (int)uVar47 / iVar49;
  local_1b8.cstep = 0;
  local_1b8.data = (void *)0x0;
  local_1b8.refcount._0_4_ = 0;
  local_1b8.refcount._4_4_ = 0;
  local_1b8.elemsize._0_4_ = 0;
  local_1b8.elemsize._4_4_ = 0;
  local_1b8.elempack = 0;
  local_1b8.allocator = (Allocator *)0x0;
  local_1b8.dims = 0;
  local_1b8.w = 0;
  local_1b8.h = 0;
  local_1b8.d = 0;
  local_1b8.c = 0;
  auVar63._0_4_ = -(uint)(0 < (this->super_Deconvolution).pad_left);
  auVar63._4_4_ = -(uint)(0 < (this->super_Deconvolution).pad_right);
  auVar63._8_4_ = -(uint)(0 < (this->super_Deconvolution).pad_top);
  auVar63._12_4_ = -(uint)(0 < (this->super_Deconvolution).pad_bottom);
  iVar22 = movmskps((int)&local_1b8 + 0x28,auVar63);
  lVar43 = 0x10;
  if ((iVar22 == 0) &&
     ((((this->super_Deconvolution).output_w < 1 || ((this->super_Deconvolution).output_h < 1)) &&
      (lVar43 = 8, &local_1b8 != top_blob)))) {
    piVar6 = top_blob->refcount;
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + 1;
      UNLOCK();
    }
    local_1b8.data = top_blob->data;
    local_1b8.refcount._0_4_ = SUB84(top_blob->refcount,0);
    local_1b8.refcount._4_4_ = (undefined4)((ulong)top_blob->refcount >> 0x20);
    local_1b8.elemsize._0_4_ = (undefined4)top_blob->elemsize;
    local_1b8.elemsize._4_4_ = (undefined4)(top_blob->elemsize >> 0x20);
    local_1b8.elempack = top_blob->elempack;
    local_1b8.allocator = top_blob->allocator;
    uVar15 = top_blob->dims;
    uVar16 = top_blob->w;
    uVar17 = top_blob->h;
    uVar18 = top_blob->d;
    local_1b8.c = top_blob->c;
    local_1b8.cstep = top_blob->cstep;
    lVar43 = 8;
    local_1b8.dims = uVar15;
    local_1b8.w = uVar16;
    local_1b8.h = uVar17;
    local_1b8.d = uVar18;
  }
  iVar23 = (iVar33 + -1) * iVar23;
  iVar55 = (iVar4 + -1) * iVar35 + iVar23 + iVar55 + 1;
  local_140 = opt;
  local_128 = top_blob;
  Mat::create(&local_1b8,iVar55,iVar48 + 1 + (iVar5 + -1) * iVar51 + local_134,uVar47,
              uVar36 / (ulong)local_160 << bVar46 * '\x02',iVar49,
              *(Allocator **)(&opt->lightmode + lVar43));
  iVar35 = local_1b8.h;
  iVar33 = local_1b8.w;
  auVar64 = _DAT_005e2f60;
  auVar63 = _DAT_005e2f20;
  if ((local_1b8.data == (void *)0x0) || ((long)local_1b8.c * local_1b8.cstep == 0)) {
    iVar23 = -100;
    goto LAB_0028e699;
  }
  uVar34 = (this->super_Deconvolution).kernel_w;
  uVar29 = (this->super_Deconvolution).kernel_h;
  iVar51 = uVar29 * uVar34;
  if (local_140->use_sgemm_convolution == true) {
    local_c8 = bottom_blob->data;
    piVar6 = bottom_blob->refcount;
    uStack_c0 = SUB84(piVar6,0);
    uStack_bc = (undefined4)((ulong)piVar6 >> 0x20);
    local_b8 = (undefined4)bottom_blob->elemsize;
    uStack_b4 = (undefined4)(bottom_blob->elemsize >> 0x20);
    local_b0 = bottom_blob->elempack;
    local_a8 = bottom_blob->allocator;
    uVar19 = bottom_blob->dims;
    uVar20 = bottom_blob->d;
    local_90 = bottom_blob->c;
    local_88 = bottom_blob->cstep;
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + 1;
      UNLOCK();
    }
    local_a0 = CONCAT44(bottom_blob->h * bottom_blob->w,uVar19);
    uStack_98 = CONCAT44(uVar20,1);
    local_d8 = 0;
    local_118 = (void *)0x0;
    uStack_110 = 0;
    uStack_10c = 0;
    local_108 = 0;
    uStack_104 = 0;
    uStack_100 = 0;
    local_f8 = (long *)0x0;
    uStack_f0 = 0;
    iStack_ec = 0;
    uStack_e8 = 0;
    uStack_e4 = 0;
    local_e0 = 0;
    local_78._0_1_ = local_140->lightmode;
    local_78._1_1_ = local_140->use_shader_pack8;
    local_78._2_1_ = local_140->use_subgroup_ops;
    local_78._3_1_ = local_140->use_reserved_0;
    local_78._4_4_ = local_140->num_threads;
    local_68 = local_140->workspace_allocator;
    uStack_60._0_4_ = local_140->openmp_blocktime;
    uStack_60._4_1_ = local_140->use_winograd_convolution;
    uStack_60._5_1_ = local_140->use_sgemm_convolution;
    uStack_60._6_1_ = local_140->use_int8_inference;
    uStack_60._7_1_ = local_140->use_vulkan_compute;
    local_58._0_1_ = local_140->use_bf16_storage;
    local_58._1_1_ = local_140->use_fp16_packed;
    local_58._2_1_ = local_140->use_fp16_storage;
    local_58._3_1_ = local_140->use_fp16_arithmetic;
    local_58._4_1_ = local_140->use_int8_packed;
    local_58._5_1_ = local_140->use_int8_storage;
    local_58._6_1_ = local_140->use_int8_arithmetic;
    local_58._7_1_ = local_140->use_packing_layout;
    uStack_50._0_4_ = local_140->vulkan_device_index;
    uStack_50._4_1_ = local_140->use_reserved_1;
    uStack_50._5_1_ = local_140->use_image_storage;
    uStack_50._6_1_ = local_140->use_tensor_storage;
    uStack_50._7_1_ = local_140->use_reserved_2;
    local_48._0_4_ = local_140->flush_denormals;
    local_48._4_1_ = local_140->use_local_pool_allocator;
    local_48._5_1_ = local_140->use_shader_local_memory;
    local_48._6_1_ = local_140->use_cooperative_matrix;
    local_48._7_1_ = local_140->use_winograd23_convolution;
    uStack_40._0_1_ = local_140->use_winograd43_convolution;
    uStack_40._1_1_ = local_140->use_winograd63_convolution;
    uStack_40._2_1_ = local_140->use_a53_a55_optimized_kernel;
    uStack_40._3_1_ = local_140->use_fp16_uniform;
    uStack_40._4_1_ = local_140->use_int8_uniform;
    uStack_40._5_1_ = local_140->use_reserved_9;
    uStack_40._6_1_ = local_140->use_reserved_10;
    uStack_40._7_1_ = local_140->use_reserved_11;
    pAStack_70 = local_1b8.allocator;
    iVar23 = (*this->gemm->_vptr_Layer[7])(this->gemm,&local_c8,&local_118);
    if (iVar23 != 0) {
      piVar6 = (int *)CONCAT44(uStack_10c,uStack_110);
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if (*piVar6 == 0) {
          if (local_f8 == (long *)0x0) {
            if (local_118 != (void *)0x0) {
              free(local_118);
            }
          }
          else {
            (**(code **)(*local_f8 + 0x18))();
          }
        }
      }
      local_d8 = 0;
      local_118 = (void *)0x0;
      uStack_110 = 0;
      uStack_10c = 0;
      local_108 = 0;
      uStack_104 = 0;
      uStack_100 = 0;
      uStack_f0 = 0;
      iStack_ec = 0;
      uStack_e8 = 0;
      uStack_e4 = 0;
      local_e0 = 0;
      piVar6 = (int *)CONCAT44(uStack_bc,uStack_c0);
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if (*piVar6 == 0) {
          if (local_a8 == (Allocator *)0x0) {
            if (local_c8 != (void *)0x0) {
              free(local_c8);
            }
          }
          else {
            (**(code **)(*(long *)local_a8 + 0x18))();
          }
        }
      }
      local_88 = 0;
      local_c8 = (void *)0x0;
      uStack_c0 = 0;
      uStack_bc = 0;
      local_b8 = 0;
      uStack_b4 = 0;
      local_b0 = 0;
      local_a0 = 0;
      uStack_98 = 0;
      local_90 = 0;
      goto LAB_0028e699;
    }
    iVar23 = iVar55 * (this->super_Deconvolution).stride_h -
             (this->super_Deconvolution).stride_w * iVar4 << bVar46 * '\x02';
    if (bVar46 == 0) {
      if (0 < (int)uVar47) goto LAB_0028e174;
    }
    else {
      if (0 < (int)uVar47) {
        uVar36 = 0;
        do {
          pfVar52 = (float *)((long)iStack_ec * uVar36 * (long)iVar51 *
                              CONCAT44(uStack_104,local_108) + (long)local_118);
          lVar43 = (long)local_1b8.w;
          uVar42 = CONCAT44(local_1b8.elemsize._4_4_,(undefined4)local_1b8.elemsize);
          puVar41 = (undefined4 *)(local_1b8.cstep * uVar36 * uVar42 + (long)local_1b8.data);
          uVar44 = local_1b8.h * lVar43;
          uVar45 = (uVar42 * uVar44 + 0xf & 0xfffffffffffffff0) / uVar42;
          if (local_1b8.dims == 4) {
            uVar45 = uVar44;
          }
          pvVar8 = (this->super_Deconvolution).bias_data.data;
          if ((pvVar8 == (void *)0x0) ||
             ((long)(this->super_Deconvolution).bias_data.c *
              (this->super_Deconvolution).bias_data.cstep == 0)) {
            uVar34 = local_1b8.d * (int)uVar45;
            if (0 < (int)uVar34) {
              memset(puVar41,0,(ulong)uVar34 << 4);
            }
          }
          else {
            iVar33 = local_1b8.d * (int)uVar45;
            if (0 < iVar33) {
              puVar32 = (undefined4 *)((long)pvVar8 + uVar36 * 0x10);
              uVar83 = *puVar32;
              uVar3 = puVar32[1];
              uVar13 = puVar32[2];
              uVar14 = puVar32[3];
              puVar32 = puVar41;
              do {
                *puVar32 = uVar83;
                puVar32[1] = uVar3;
                puVar32[2] = uVar13;
                puVar32[3] = uVar14;
                puVar32 = puVar32 + 4;
                iVar33 = iVar33 + -1;
              } while (iVar33 != 0);
            }
          }
          if (0 < (this->super_Deconvolution).kernel_h) {
            iVar33 = 0;
            do {
              if (0 < (this->super_Deconvolution).kernel_w) {
                iVar35 = 0;
                do {
                  if (0 < iVar5) {
                    pfVar40 = (float *)((long)puVar41 +
                                       (long)((this->super_Deconvolution).dilation_w * iVar35 * 4) *
                                       4 + (long)(this->super_Deconvolution).dilation_h *
                                           (long)iVar33 * uVar42 * lVar43);
                    iVar55 = 0;
                    do {
                      iVar48 = iVar4;
                      if (0 < iVar4) {
                        do {
                          fVar62 = pfVar52[1];
                          auVar95._0_4_ = pfVar52[2];
                          fVar65 = pfVar52[3];
                          *pfVar40 = *pfVar52 + *pfVar40;
                          pfVar40[1] = fVar62 + pfVar40[1];
                          pfVar40[2] = auVar95._0_4_ + pfVar40[2];
                          pfVar40[3] = fVar65 + pfVar40[3];
                          pfVar40 = pfVar40 + (long)(this->super_Deconvolution).stride_w * 4;
                          pfVar52 = pfVar52 + 4;
                          iVar48 = iVar48 + -1;
                        } while (iVar48 != 0);
                      }
                      pfVar40 = pfVar40 + iVar23;
                      iVar55 = iVar55 + 1;
                    } while (iVar55 != iVar5);
                  }
                  iVar35 = iVar35 + 1;
                } while (iVar35 < (this->super_Deconvolution).kernel_w);
              }
              iVar33 = iVar33 + 1;
            } while (iVar33 < (this->super_Deconvolution).kernel_h);
          }
          uVar36 = uVar36 + 1;
        } while (uVar36 != uVar47);
      }
      if (bVar46 == 0 && 0 < (int)uVar47) {
LAB_0028e174:
        auVar67 = _DAT_005e6290;
        auVar64 = _DAT_005e6280;
        auVar63 = _DAT_005e2020;
        uVar36 = CONCAT44(local_1b8.elemsize._4_4_,(undefined4)local_1b8.elemsize);
        lVar43 = (long)local_1b8.h * (long)local_1b8.w;
        local_218 = 0;
        pvVar8 = (this->super_Deconvolution).bias_data.data;
        iVar33 = (this->super_Deconvolution).bias_data.c;
        sVar9 = (this->super_Deconvolution).bias_data.cstep;
        iVar35 = (int)((uVar36 * lVar43 + 0xf & 0xfffffffffffffff0) / uVar36);
        if (local_1b8.dims == 4) {
          iVar35 = (int)lVar43;
        }
        uVar29 = iVar35 * local_1b8.d;
        uVar34 = (this->super_Deconvolution).kernel_w;
        uVar42 = 1;
        if (1 < (int)uVar47) {
          uVar42 = (ulong)uVar47;
        }
        uVar47 = (this->super_Deconvolution).kernel_h;
        local_158._0_8_ = CONCAT44(0,uVar29 + 3 & 0xfffffffc);
        lVar43 = (ulong)uVar29 - 1;
        auVar61._8_4_ = (int)lVar43;
        auVar61._0_8_ = lVar43;
        auVar61._12_4_ = (int)((ulong)lVar43 >> 0x20);
        lVar43 = (long)local_1b8.data + 0xc;
        auVar61 = auVar61 ^ _DAT_005e2020;
        do {
          uVar83 = 0;
          if ((long)iVar33 * sVar9 != 0 && pvVar8 != (void *)0x0) {
            uVar83 = *(undefined4 *)((long)pvVar8 + local_218 * 4);
          }
          if (0 < (int)uVar29) {
            uVar45 = 0;
            do {
              auVar88._8_4_ = (int)uVar45;
              auVar88._0_8_ = uVar45;
              auVar88._12_4_ = (int)(uVar45 >> 0x20);
              auVar95 = (auVar88 | auVar67) ^ auVar63;
              iVar35 = auVar61._4_4_;
              if ((bool)(~(iVar35 < auVar95._4_4_ ||
                          auVar61._0_4_ < auVar95._0_4_ && auVar95._4_4_ == iVar35) & 1)) {
                *(undefined4 *)(lVar43 + -0xc + uVar45 * 4) = uVar83;
              }
              if (auVar95._12_4_ <= auVar61._12_4_ &&
                  (auVar95._8_4_ <= auVar61._8_4_ || auVar95._12_4_ != auVar61._12_4_)) {
                *(undefined4 *)(lVar43 + -8 + uVar45 * 4) = uVar83;
              }
              auVar95 = (auVar88 | auVar64) ^ auVar63;
              iVar55 = auVar95._4_4_;
              if (iVar55 <= iVar35 && (iVar55 != iVar35 || auVar95._0_4_ <= auVar61._0_4_)) {
                *(undefined4 *)(lVar43 + -4 + uVar45 * 4) = uVar83;
                *(undefined4 *)(lVar43 + uVar45 * 4) = uVar83;
              }
              uVar45 = uVar45 + 4;
            } while (local_158._0_8_ != uVar45);
          }
          if (0 < (int)uVar47) {
            pfVar52 = (float *)(local_218 *
                                (long)iVar51 * (long)iStack_ec * CONCAT44(uStack_104,local_108) +
                               (long)local_118);
            iVar35 = (this->super_Deconvolution).dilation_h;
            iVar55 = (this->super_Deconvolution).dilation_w;
            uVar45 = 0;
            do {
              if (0 < (int)uVar34) {
                uVar44 = 0;
                do {
                  if (0 < iVar5) {
                    pfVar40 = (float *)((long)local_1b8.data +
                                       uVar44 * (long)iVar55 * 4 +
                                       uVar45 * (long)iVar35 * uVar36 * (long)local_1b8.w +
                                       local_1b8.cstep * uVar36 * local_218);
                    iVar48 = (this->super_Deconvolution).stride_w;
                    iVar22 = 0;
                    do {
                      iVar49 = iVar4;
                      if (0 < iVar4) {
                        do {
                          *pfVar40 = *pfVar40 + *pfVar52;
                          pfVar52 = pfVar52 + 1;
                          pfVar40 = pfVar40 + iVar48;
                          iVar49 = iVar49 + -1;
                        } while (iVar49 != 0);
                      }
                      pfVar40 = pfVar40 + iVar23;
                      iVar22 = iVar22 + 1;
                    } while (iVar22 != iVar5);
                  }
                  uVar44 = uVar44 + 1;
                } while (uVar44 != uVar34);
              }
              uVar45 = uVar45 + 1;
            } while (uVar45 != uVar47);
          }
          local_218 = local_218 + 1;
          lVar43 = lVar43 + local_1b8.cstep * uVar36;
        } while (local_218 != uVar42);
      }
    }
    pLVar10 = this->activation;
    if (pLVar10 != (Layer *)0x0) {
      (*pLVar10->_vptr_Layer[9])(pLVar10,&local_1b8,local_140);
    }
    piVar6 = (int *)CONCAT44(uStack_10c,uStack_110);
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + -1;
      UNLOCK();
      if (*piVar6 == 0) {
        if (local_f8 == (long *)0x0) {
          if (local_118 != (void *)0x0) {
            free(local_118);
          }
        }
        else {
          (**(code **)(*local_f8 + 0x18))();
        }
      }
    }
    local_d8 = 0;
    local_118 = (void *)0x0;
    uStack_110 = 0;
    uStack_10c = 0;
    local_108 = 0;
    uStack_104 = 0;
    uStack_100 = 0;
    uStack_f0 = 0;
    iStack_ec = 0;
    uStack_e8 = 0;
    uStack_e4 = 0;
    local_e0 = 0;
    piVar6 = (int *)CONCAT44(uStack_bc,uStack_c0);
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + -1;
      UNLOCK();
      if (*piVar6 == 0) {
        if (local_a8 == (Allocator *)0x0) {
          if (local_c8 != (void *)0x0) {
            free(local_c8);
          }
        }
        else {
          (**(code **)(*(long *)local_a8 + 0x18))();
        }
      }
    }
    local_88 = 0;
    local_c8 = (void *)0x0;
    uStack_c0 = 0;
    uStack_bc = 0;
    local_b8 = 0;
    uStack_b4 = 0;
    local_b0 = 0;
    local_a0 = 0;
    uStack_98 = 0;
    local_90 = 0;
  }
  else {
    bVar46 = bVar46 ^ 1;
    if (((int)local_160 == 4 && bVar46 == 0) && (0 < (long)local_1b8.c)) {
      iVar4 = (this->super_Deconvolution).dilation_w;
      iVar5 = (this->super_Deconvolution).dilation_h;
      iVar55 = (this->super_Deconvolution).stride_w;
      iVar48 = (this->super_Deconvolution).stride_h;
      iVar22 = (this->super_Deconvolution).activation_type;
      pvVar8 = (this->super_Deconvolution).bias_data.data;
      local_270 = 0;
      fVar62 = (float)DAT_005e2f60;
      auVar95._0_4_ = DAT_005e2f60._4_4_;
      fVar65 = DAT_005e2f60._8_4_;
      auVar67 = _DAT_005e2f30;
      do {
        if (0 < local_1b8.h) {
          iVar49 = bottom_blob->w;
          iVar38 = bottom_blob->h;
          pauVar50 = (undefined1 (*) [16])
                     (local_1b8.cstep * local_270 *
                      CONCAT44(local_1b8.elemsize._4_4_,(undefined4)local_1b8.elemsize) +
                     (long)local_1b8.data);
          uVar47 = bottom_blob->c;
          local_168 = (void *)(local_270 * 0x10);
          local_260 = 0;
          do {
            if (0 < local_1b8.w) {
              uVar37 = 0;
              iVar53 = (1 - uVar34) * iVar4;
              do {
                auVar59 = ZEXT816(0);
                if (pvVar8 == (void *)0x0) {
                  auVar85 = ZEXT816(0);
                }
                else {
                  auVar85 = *(undefined1 (*) [16])((long)pvVar8 + (long)local_168);
                }
                if (0 < (int)uVar47) {
                  pvVar56 = (void *)((this->weight_data_tm).cstep * local_270 *
                                     (this->weight_data_tm).elemsize +
                                    (long)(this->weight_data_tm).data);
                  pvVar58 = bottom_blob->data;
                  lVar43 = (long)bottom_blob->w * bottom_blob->elemsize;
                  local_158._0_8_ = lVar43;
                  uVar36 = 0;
                  do {
                    if (0 < (int)uVar29) {
                      uVar42 = 0;
                      uVar45 = 0;
                      do {
                        iVar24 = (((int)uVar45 - uVar29) + 1) * iVar5 + local_260;
                        if ((((-1 < iVar24) && (iVar25 = iVar24 / iVar48, iVar24 % iVar48 == 0)) &&
                            (0 < (int)uVar34)) && (iVar25 < iVar38)) {
                          lVar31 = iVar25 * lVar43 +
                                   bottom_blob->cstep * bottom_blob->elemsize * uVar36;
                          uVar44 = uVar42;
                          uVar54 = (ulong)uVar34;
                          iVar24 = iVar53;
                          do {
                            if (((-1 < iVar24) && (iVar25 = iVar24 / iVar55, iVar24 % iVar55 == 0))
                               && (iVar25 < iVar49)) {
                              lVar30 = (long)(iVar25 << 2);
                              fVar75 = *(float *)((long)pvVar58 + lVar30 * 4 + lVar31);
                              fVar66 = *(float *)((long)pvVar58 + lVar30 * 4 + lVar31 + 4);
                              uVar39 = uVar44 & 0xffffffff;
                              pfVar52 = (float *)((long)pvVar56 + uVar39 * 4);
                              fVar90 = *(float *)((long)pvVar58 + lVar30 * 4 + lVar31 + 8);
                              fVar99 = auVar85._4_4_;
                              fVar100 = auVar85._8_4_;
                              fVar101 = auVar85._12_4_;
                              fVar74 = *(float *)((long)pvVar58 + lVar30 * 4 + lVar31 + 0xc);
                              pfVar40 = (float *)((long)pvVar56 + uVar39 * 4 + 0x10);
                              pfVar1 = (float *)((long)pvVar56 + uVar39 * 4 + 0x20);
                              pfVar2 = (float *)((long)pvVar56 + uVar39 * 4 + 0x30);
                              auVar85._0_4_ =
                                   fVar74 * *pfVar2 +
                                   fVar90 * *pfVar1 + fVar66 * *pfVar40 +
                                   fVar75 * *pfVar52 + auVar85._0_4_;
                              auVar85._4_4_ =
                                   fVar74 * pfVar2[1] +
                                   fVar90 * pfVar1[1] + fVar66 * pfVar40[1] +
                                   fVar75 * pfVar52[1] + fVar99;
                              auVar85._8_4_ =
                                   fVar74 * pfVar2[2] +
                                   fVar90 * pfVar1[2] + fVar66 * pfVar40[2] +
                                   fVar75 * pfVar52[2] + fVar100;
                              auVar85._12_4_ =
                                   fVar74 * pfVar2[3] +
                                   fVar90 * pfVar1[3] + fVar66 * pfVar40[3] +
                                   fVar75 * pfVar52[3] + fVar101;
                            }
                            uVar44 = uVar44 + 0x10;
                            iVar24 = iVar24 + iVar4;
                            uVar54 = uVar54 - 1;
                          } while (uVar54 != 0);
                        }
                        uVar45 = uVar45 + 1;
                        uVar42 = uVar42 + (ulong)uVar34 * 0x10;
                      } while (uVar45 != uVar29);
                    }
                    pvVar56 = (void *)((long)pvVar56 + (long)(int)(uVar34 * uVar29 * 0x10) * 4);
                    uVar36 = uVar36 + 1;
                  } while (uVar36 != uVar47);
                }
                fVar66 = auVar85._4_4_;
                fVar90 = auVar85._8_4_;
                fVar74 = auVar85._12_4_;
                fVar75 = auVar64._12_4_;
                switch(iVar22) {
                case 1:
                  auVar85 = maxps(auVar85,auVar59);
                  break;
                case 2:
                  auVar69 = maxps(auVar85,auVar59);
                  auVar59 = minps(auVar85,auVar59);
                  fVar75 = *(this->super_Deconvolution).activation_params.data;
                  auVar85._4_4_ = fVar75 * auVar59._4_4_ + auVar69._4_4_;
                  auVar85._0_4_ = fVar75 * auVar59._0_4_ + auVar69._0_4_;
                  auVar85._8_4_ = fVar75 * auVar59._8_4_ + auVar69._8_4_;
                  auVar85._12_4_ = fVar75 * auVar59._12_4_ + auVar69._12_4_;
                  break;
                case 3:
                  puVar41 = (undefined4 *)(this->super_Deconvolution).activation_params.data;
                  uVar83 = *puVar41;
                  uVar3 = puVar41[1];
                  auVar68._4_4_ = uVar83;
                  auVar68._0_4_ = uVar83;
                  auVar68._8_4_ = uVar83;
                  auVar68._12_4_ = uVar83;
                  auVar91._4_4_ = uVar3;
                  auVar91._0_4_ = uVar3;
                  auVar91._8_4_ = uVar3;
                  auVar91._12_4_ = uVar3;
                  auVar59 = maxps(auVar85,auVar68);
                  auVar85 = minps(auVar59,auVar91);
                  break;
                case 4:
                  auVar84._0_8_ = auVar85._0_8_ ^ 0x8000000080000000;
                  auVar84._8_4_ = -fVar90;
                  auVar84._12_4_ = -fVar74;
                  auVar59 = minps(auVar84,auVar63);
                  auVar59 = maxps(auVar59,auVar67);
                  fVar90 = auVar59._0_4_ * 1.442695 + 0.5;
                  fVar99 = auVar59._4_4_ * 1.442695 + 0.5;
                  fVar101 = auVar59._8_4_ * 1.442695 + 0.5;
                  fVar89 = auVar59._12_4_ * 1.442695 + 0.5;
                  fVar66 = (float)(int)fVar90;
                  fVar74 = (float)(int)fVar99;
                  fVar100 = (float)(int)fVar101;
                  fVar102 = (float)(int)fVar89;
                  fVar66 = fVar66 - (float)(-(uint)(fVar90 < fVar66) & (uint)fVar62);
                  fVar74 = fVar74 - (float)(-(uint)(fVar99 < fVar74) & (uint)auVar95._0_4_);
                  fVar100 = fVar100 - (float)(-(uint)(fVar101 < fVar100) & (uint)fVar65);
                  fVar102 = fVar102 - (float)(-(uint)(fVar89 < fVar102) & (uint)fVar75);
                  fVar90 = fVar66 * -0.6931472 + auVar59._0_4_;
                  fVar99 = fVar74 * -0.6931472 + auVar59._4_4_;
                  fVar101 = fVar100 * -0.6931472 + auVar59._8_4_;
                  fVar89 = fVar102 * -0.6931472 + auVar59._12_4_;
                  auVar92._0_4_ =
                       (float)((int)fVar66 * 0x800000 + (int)fVar62) *
                       (fVar90 + fVar62 +
                       (((((fVar90 * 0.00019875691 + 0.0013981999) * fVar90 + 0.008333452) * fVar90
                         + 0.041665796) * fVar90 + 0.16666666) * fVar90 + 0.5) * fVar90 * fVar90) +
                       fVar62;
                  auVar92._4_4_ =
                       (float)((int)fVar74 * 0x800000 + (int)auVar95._0_4_) *
                       (fVar99 + auVar95._0_4_ +
                       (((((fVar99 * 0.00019875691 + 0.0013981999) * fVar99 + 0.008333452) * fVar99
                         + 0.041665796) * fVar99 + 0.16666666) * fVar99 + 0.5) * fVar99 * fVar99) +
                       auVar95._0_4_;
                  auVar92._8_4_ =
                       (float)((int)fVar100 * 0x800000 + (int)fVar65) *
                       (fVar101 + fVar65 +
                       (((((fVar101 * 0.00019875691 + 0.0013981999) * fVar101 + 0.008333452) *
                          fVar101 + 0.041665796) * fVar101 + 0.16666666) * fVar101 + 0.5) *
                       fVar101 * fVar101) + fVar65;
                  auVar92._12_4_ =
                       (float)((int)fVar102 * 0x800000 + (int)fVar75) *
                       (fVar89 + fVar75 +
                       (((((fVar89 * 0.00019875691 + 0.0013981999) * fVar89 + 0.008333452) * fVar89
                         + 0.041665796) * fVar89 + 0.16666666) * fVar89 + 0.5) * fVar89 * fVar89) +
                       fVar75;
                  auVar85 = divps(auVar64,auVar92);
                  break;
                case 5:
                  auVar59 = minps(auVar85,auVar63);
                  auVar67 = maxps(auVar59,auVar67);
                  fVar99 = auVar67._0_4_ * 1.442695 + 0.5;
                  fVar100 = auVar67._4_4_ * 1.442695 + 0.5;
                  fVar101 = auVar67._8_4_ * 1.442695 + 0.5;
                  fVar102 = auVar67._12_4_ * 1.442695 + 0.5;
                  fVar89 = (float)(int)fVar99;
                  fVar96 = (float)(int)fVar100;
                  fVar97 = (float)(int)fVar101;
                  fVar98 = (float)(int)fVar102;
                  fVar89 = fVar89 - (float)(-(uint)(fVar99 < fVar89) & (uint)fVar62);
                  fVar96 = fVar96 - (float)(-(uint)(fVar100 < fVar96) & (uint)auVar95._0_4_);
                  fVar97 = fVar97 - (float)(-(uint)(fVar101 < fVar97) & (uint)fVar65);
                  fVar98 = fVar98 - (float)(-(uint)(fVar102 < fVar98) & (uint)fVar75);
                  fVar99 = auVar67._0_4_ - fVar89 * 0.6931472;
                  fVar100 = auVar67._4_4_ - fVar96 * 0.6931472;
                  fVar101 = auVar67._8_4_ - fVar97 * 0.6931472;
                  fVar102 = auVar67._12_4_ - fVar98 * 0.6931472;
                  auVar103._0_4_ =
                       (float)((int)fVar89 * 0x800000 + (int)fVar62) *
                       (fVar99 + fVar62 +
                       (((((fVar99 * 0.00019875691 + 0.0013981999) * fVar99 + 0.008333452) * fVar99
                         + 0.041665796) * fVar99 + 0.16666666) * fVar99 + 0.5) * fVar99 * fVar99) +
                       fVar62;
                  auVar103._4_4_ =
                       (float)((int)fVar96 * 0x800000 + (int)auVar95._0_4_) *
                       (fVar100 + auVar95._0_4_ +
                       (((((fVar100 * 0.00019875691 + 0.0013981999) * fVar100 + 0.008333452) *
                          fVar100 + 0.041665796) * fVar100 + 0.16666666) * fVar100 + 0.5) *
                       fVar100 * fVar100) + auVar95._0_4_;
                  auVar103._8_4_ =
                       (float)((int)fVar97 * 0x800000 + (int)fVar65) *
                       (fVar101 + fVar65 +
                       (((((fVar101 * 0.00019875691 + 0.0013981999) * fVar101 + 0.008333452) *
                          fVar101 + 0.041665796) * fVar101 + 0.16666666) * fVar101 + 0.5) *
                       fVar101 * fVar101) + fVar65;
                  auVar103._12_4_ =
                       (float)((int)fVar98 * 0x800000 + (int)fVar75) *
                       (fVar102 + fVar75 +
                       (((((fVar102 * 0.00019875691 + 0.0013981999) * fVar102 + 0.008333452) *
                          fVar102 + 0.041665796) * fVar102 + 0.16666666) * fVar102 + 0.5) *
                       fVar102 * fVar102) + fVar75;
                  auVar67 = maxps(auVar103,_DAT_005e2fd0);
                  fVar99 = (float)(auVar67._0_4_ & 0x807fffff | 0x3f000000);
                  fVar101 = (float)(auVar67._4_4_ & 0x807fffff | 0x3f000000);
                  fVar89 = (float)(auVar67._8_4_ & 0x807fffff | 0x3f000000);
                  fVar97 = (float)(auVar67._12_4_ & 0x807fffff | 0x3f000000);
                  fVar100 = fVar99 + (float)DAT_005e3010 +
                            (float)(-(uint)(fVar99 < 0.70710677) & (uint)fVar99);
                  fVar102 = fVar101 + DAT_005e3010._4_4_ +
                            (float)(-(uint)(fVar101 < 0.70710677) & (uint)fVar101);
                  fVar96 = fVar89 + DAT_005e3010._8_4_ +
                           (float)(-(uint)(fVar89 < 0.70710677) & (uint)fVar89);
                  fVar98 = fVar97 + DAT_005e3010._12_4_ +
                           (float)(-(uint)(fVar97 < 0.70710677) & (uint)fVar97);
                  auVar76._0_4_ =
                       ~-(uint)(auVar103._0_4_ <= 0.0) &
                       (uint)((((float)(int)((auVar67._0_4_ >> 0x17) - 0x7e) -
                               (float)(-(uint)(fVar99 < 0.70710677) & (uint)fVar62)) * 0.6931472 +
                               fVar100 +
                              (((((((((fVar100 * 0.070376836 + -0.1151461) * fVar100 + 0.116769984)
                                     * fVar100 + -0.12420141) * fVar100 + 0.14249323) * fVar100 +
                                  -0.16668057) * fVar100 + 0.20000714) * fVar100 + -0.24999994) *
                                fVar100 + 0.3333333) * fVar100 + -0.5) * fVar100 * fVar100) * -2.0);
                  auVar76._4_4_ =
                       ~-(uint)(auVar103._4_4_ <= 0.0) &
                       (uint)((((float)(int)((auVar67._4_4_ >> 0x17) - 0x7e) -
                               (float)(-(uint)(fVar101 < 0.70710677) & (uint)auVar95._0_4_)) *
                               0.6931472 + fVar102 +
                              (((((((((fVar102 * 0.070376836 + -0.1151461) * fVar102 + 0.116769984)
                                     * fVar102 + -0.12420141) * fVar102 + 0.14249323) * fVar102 +
                                  -0.16668057) * fVar102 + 0.20000714) * fVar102 + -0.24999994) *
                                fVar102 + 0.3333333) * fVar102 + -0.5) * fVar102 * fVar102) * -2.0);
                  auVar76._8_4_ =
                       ~-(uint)(auVar103._8_4_ <= 0.0) &
                       (uint)((((float)(int)((auVar67._8_4_ >> 0x17) - 0x7e) -
                               (float)(-(uint)(fVar89 < 0.70710677) & (uint)fVar65)) * 0.6931472 +
                               fVar96 + (((((((((fVar96 * 0.070376836 + -0.1151461) * fVar96 +
                                               0.116769984) * fVar96 + -0.12420141) * fVar96 +
                                             0.14249323) * fVar96 + -0.16668057) * fVar96 +
                                           0.20000714) * fVar96 + -0.24999994) * fVar96 + 0.3333333)
                                         * fVar96 + -0.5) * fVar96 * fVar96) * -2.0);
                  auVar76._12_4_ =
                       ~-(uint)(auVar103._12_4_ <= 0.0) &
                       (uint)((((float)(int)((auVar67._12_4_ >> 0x17) - 0x7e) -
                               (float)(-(uint)(fVar97 < 0.70710677) & (uint)fVar75)) * 0.6931472 +
                               fVar98 + (((((((((fVar98 * 0.070376836 + -0.1151461) * fVar98 +
                                               0.116769984) * fVar98 + -0.12420141) * fVar98 +
                                             0.14249323) * fVar98 + -0.16668057) * fVar98 +
                                           0.20000714) * fVar98 + -0.24999994) * fVar98 + 0.3333333)
                                         * fVar98 + -0.5) * fVar98 * fVar98) * -2.0);
                  auVar67._0_8_ =
                       CONCAT44(-(uint)(auVar103._4_4_ <= 0.0),-(uint)(auVar103._0_4_ <= 0.0)) &
                       0x7fffffff7fffffff;
                  auVar67._8_4_ = -(uint)(auVar103._8_4_ <= 0.0) & 0x7fffffff;
                  auVar67._12_4_ = -(uint)(auVar103._12_4_ <= 0.0) & 0x7fffffff;
                  auVar67 = minps(auVar67 | auVar76,auVar63);
                  auVar67 = maxps(auVar67,_DAT_005e2f30);
                  fVar99 = auVar67._0_4_ * 1.442695 + 0.5;
                  fVar100 = auVar67._4_4_ * 1.442695 + 0.5;
                  fVar101 = auVar67._8_4_ * 1.442695 + 0.5;
                  fVar102 = auVar67._12_4_ * 1.442695 + 0.5;
                  fVar89 = (float)(int)fVar99;
                  fVar96 = (float)(int)fVar100;
                  fVar97 = (float)(int)fVar101;
                  fVar98 = (float)(int)fVar102;
                  fVar89 = fVar89 - (float)(-(uint)(fVar99 < fVar89) & (uint)fVar62);
                  fVar96 = fVar96 - (float)(-(uint)(fVar100 < fVar96) & (uint)auVar95._0_4_);
                  fVar97 = fVar97 - (float)(-(uint)(fVar101 < fVar97) & (uint)fVar65);
                  fVar98 = fVar98 - (float)(-(uint)(fVar102 < fVar98) & (uint)fVar75);
                  fVar99 = auVar67._0_4_ - fVar89 * 0.6931472;
                  fVar100 = auVar67._4_4_ - fVar96 * 0.6931472;
                  fVar101 = auVar67._8_4_ - fVar97 * 0.6931472;
                  fVar102 = auVar67._12_4_ - fVar98 * 0.6931472;
                  auVar77._0_4_ =
                       (float)((int)fVar89 * 0x800000 + (int)fVar62) *
                       (fVar99 + fVar62 +
                       (((((fVar99 * 0.00019875691 + 0.0013981999) * fVar99 + 0.008333452) * fVar99
                         + 0.041665796) * fVar99 + 0.16666666) * fVar99 + 0.5) * fVar99 * fVar99) +
                       fVar62;
                  auVar77._4_4_ =
                       (float)((int)fVar96 * 0x800000 + (int)auVar95._0_4_) *
                       (fVar100 + auVar95._0_4_ +
                       (((((fVar100 * 0.00019875691 + 0.0013981999) * fVar100 + 0.008333452) *
                          fVar100 + 0.041665796) * fVar100 + 0.16666666) * fVar100 + 0.5) *
                       fVar100 * fVar100) + auVar95._0_4_;
                  auVar77._8_4_ =
                       (float)((int)fVar97 * 0x800000 + (int)fVar65) *
                       (fVar101 + fVar65 +
                       (((((fVar101 * 0.00019875691 + 0.0013981999) * fVar101 + 0.008333452) *
                          fVar101 + 0.041665796) * fVar101 + 0.16666666) * fVar101 + 0.5) *
                       fVar101 * fVar101) + fVar65;
                  auVar77._12_4_ =
                       (float)((int)fVar98 * 0x800000 + (int)fVar75) *
                       (fVar102 + fVar75 +
                       (((((fVar102 * 0.00019875691 + 0.0013981999) * fVar102 + 0.008333452) *
                          fVar102 + 0.041665796) * fVar102 + 0.16666666) * fVar102 + 0.5) *
                       fVar102 * fVar102) + fVar75;
                  auVar67 = divps(_DAT_005e3bf0,auVar77);
                  auVar59._0_4_ = auVar67._0_4_ + (float)DAT_005e3010;
                  auVar59._4_4_ = auVar67._4_4_ + DAT_005e3010._4_4_;
                  auVar59._8_4_ = auVar67._8_4_ + DAT_005e3010._8_4_;
                  auVar59._12_4_ = auVar67._12_4_ + DAT_005e3010._12_4_;
                  auVar67 = _DAT_005e2f30;
                  goto LAB_0028cea1;
                case 6:
                  pfVar52 = (float *)(this->super_Deconvolution).activation_params.data;
                  fVar75 = *pfVar52;
                  fVar99 = pfVar52[1];
                  auVar69._0_4_ = fVar75 * auVar85._0_4_ + fVar99;
                  auVar69._4_4_ = fVar75 * fVar66 + fVar99;
                  auVar69._8_4_ = fVar75 * fVar90 + fVar99;
                  auVar69._12_4_ = fVar75 * fVar74 + fVar99;
                  auVar59 = maxps(auVar69,auVar59);
                  auVar59 = minps(auVar59,auVar64);
LAB_0028cea1:
                  auVar85._0_4_ = auVar85._0_4_ * auVar59._0_4_;
                  auVar85._4_4_ = fVar66 * auVar59._4_4_;
                  auVar85._8_4_ = fVar90 * auVar59._8_4_;
                  auVar85._12_4_ = fVar74 * auVar59._12_4_;
                }
                *pauVar50 = auVar85;
                pauVar50 = pauVar50 + 1;
                uVar37 = uVar37 + 1;
                iVar53 = iVar53 + 1;
              } while (uVar37 != local_1b8.w);
            }
            local_260 = local_260 + 1;
          } while (local_260 != local_1b8.h);
        }
        local_270 = local_270 + 1;
      } while (local_270 != local_1b8.c);
    }
    auVar64 = _DAT_005e2f60;
    auVar63 = _DAT_005e2f20;
    if (((int)local_160 == 1 && bVar46 == 0) && (0 < (long)local_1b8.c)) {
      iVar4 = (this->super_Deconvolution).dilation_w;
      iVar5 = (this->super_Deconvolution).dilation_h;
      iVar55 = (this->super_Deconvolution).stride_w;
      iVar48 = (this->super_Deconvolution).stride_h;
      iVar22 = (this->super_Deconvolution).activation_type;
      pvVar8 = (this->super_Deconvolution).bias_data.data;
      uVar47 = (this->super_Deconvolution).kernel_w;
      uVar34 = (this->super_Deconvolution).kernel_h;
      local_270 = 0;
      auVar59 = (undefined1  [16])0x0;
      fVar62 = (float)DAT_005e2f60;
      auVar95._0_4_ = DAT_005e2f60._4_4_;
      fVar65 = DAT_005e2f60._8_4_;
      auVar67 = _DAT_005e2f30;
      do {
        if (0 < local_1b8.h) {
          iVar49 = bottom_blob->w;
          iVar38 = bottom_blob->h;
          pauVar50 = (undefined1 (*) [16])
                     (local_1b8.cstep * local_270 *
                      CONCAT44(local_1b8.elemsize._4_4_,(undefined4)local_1b8.elemsize) +
                     (long)local_1b8.data);
          uVar29 = bottom_blob->c;
          local_168 = (void *)(local_270 * 0x10);
          local_260 = 0;
          do {
            if (0 < local_1b8.w) {
              uVar37 = 0;
              iVar53 = (1 - uVar47) * iVar4;
              do {
                if (pvVar8 == (void *)0x0) {
                  auVar87 = ZEXT816(0);
                }
                else {
                  auVar87 = *(undefined1 (*) [16])((long)pvVar8 + (long)local_168);
                }
                if (0 < (int)uVar29) {
                  pvVar56 = (void *)((this->weight_data_tm).cstep * local_270 *
                                     (this->weight_data_tm).elemsize +
                                    (long)(this->weight_data_tm).data);
                  lVar43 = (long)bottom_blob->w * bottom_blob->elemsize;
                  local_158._0_8_ = lVar43;
                  uVar36 = 0;
                  do {
                    if (0 < (int)uVar34) {
                      uVar42 = 0;
                      uVar45 = 0;
                      do {
                        iVar24 = (((int)uVar45 - uVar34) + 1) * iVar5 + local_260;
                        if ((((-1 < iVar24) && (iVar25 = iVar24 / iVar48, iVar24 % iVar48 == 0)) &&
                            (iVar25 < iVar38)) && (0 < (int)uVar47)) {
                          uVar44 = (ulong)uVar47;
                          uVar54 = uVar42;
                          auVar85 = auVar87;
                          iVar24 = iVar53;
                          do {
                            auVar87 = auVar85;
                            if (((-1 < iVar24) && (iVar26 = iVar24 / iVar55, iVar24 % iVar55 == 0))
                               && (iVar26 < iVar49)) {
                              fVar75 = *(float *)((long)bottom_blob->data +
                                                 (long)iVar26 * 4 +
                                                 iVar25 * lVar43 +
                                                 bottom_blob->cstep * bottom_blob->elemsize * uVar36
                                                 );
                              pfVar52 = (float *)((long)pvVar56 + (uVar54 & 0xffffffff) * 4);
                              auVar87._0_4_ = auVar85._0_4_ + fVar75 * *pfVar52;
                              auVar87._4_4_ = auVar85._4_4_ + fVar75 * pfVar52[1];
                              auVar87._8_4_ = auVar85._8_4_ + fVar75 * pfVar52[2];
                              auVar87._12_4_ = auVar85._12_4_ + fVar75 * pfVar52[3];
                            }
                            uVar54 = uVar54 + 4;
                            iVar24 = iVar24 + iVar4;
                            uVar44 = uVar44 - 1;
                            auVar85 = auVar87;
                          } while (uVar44 != 0);
                        }
                        uVar45 = uVar45 + 1;
                        uVar42 = uVar42 + (ulong)uVar47 * 4;
                      } while (uVar45 != uVar34);
                    }
                    pvVar56 = (void *)((long)pvVar56 + (long)(int)(uVar47 * uVar34 * 4) * 4);
                    uVar36 = uVar36 + 1;
                  } while (uVar36 != uVar29);
                }
                fVar66 = auVar87._4_4_;
                fVar90 = auVar87._8_4_;
                fVar74 = auVar87._12_4_;
                fVar75 = auVar64._12_4_;
                switch(iVar22) {
                case 1:
                  auVar87 = maxps(auVar87,auVar59);
                  break;
                case 2:
                  auVar85 = maxps(auVar87,auVar59);
                  auVar69 = minps(auVar87,auVar59);
                  fVar75 = *(this->super_Deconvolution).activation_params.data;
                  auVar87._4_4_ = fVar75 * auVar69._4_4_ + auVar85._4_4_;
                  auVar87._0_4_ = fVar75 * auVar69._0_4_ + auVar85._0_4_;
                  auVar87._8_4_ = fVar75 * auVar69._8_4_ + auVar85._8_4_;
                  auVar87._12_4_ = fVar75 * auVar69._12_4_ + auVar85._12_4_;
                  break;
                case 3:
                  puVar41 = (undefined4 *)(this->super_Deconvolution).activation_params.data;
                  uVar83 = *puVar41;
                  uVar3 = puVar41[1];
                  auVar71._4_4_ = uVar83;
                  auVar71._0_4_ = uVar83;
                  auVar71._8_4_ = uVar83;
                  auVar71._12_4_ = uVar83;
                  auVar93._4_4_ = uVar3;
                  auVar93._0_4_ = uVar3;
                  auVar93._8_4_ = uVar3;
                  auVar93._12_4_ = uVar3;
                  auVar85 = maxps(auVar87,auVar71);
                  auVar87 = minps(auVar85,auVar93);
                  break;
                case 4:
                  auVar86._0_8_ = auVar87._0_8_ ^ 0x8000000080000000;
                  auVar86._8_4_ = -fVar90;
                  auVar86._12_4_ = -fVar74;
                  auVar85 = minps(auVar86,auVar63);
                  auVar85 = maxps(auVar85,auVar67);
                  fVar90 = auVar85._0_4_ * 1.442695 + 0.5;
                  fVar99 = auVar85._4_4_ * 1.442695 + 0.5;
                  fVar101 = auVar85._8_4_ * 1.442695 + 0.5;
                  fVar89 = auVar85._12_4_ * 1.442695 + 0.5;
                  fVar66 = (float)(int)fVar90;
                  fVar74 = (float)(int)fVar99;
                  fVar100 = (float)(int)fVar101;
                  fVar102 = (float)(int)fVar89;
                  fVar66 = fVar66 - (float)(-(uint)(fVar90 < fVar66) & (uint)fVar62);
                  fVar74 = fVar74 - (float)(-(uint)(fVar99 < fVar74) & (uint)auVar95._0_4_);
                  fVar100 = fVar100 - (float)(-(uint)(fVar101 < fVar100) & (uint)fVar65);
                  fVar102 = fVar102 - (float)(-(uint)(fVar89 < fVar102) & (uint)fVar75);
                  fVar90 = fVar66 * -0.6931472 + auVar85._0_4_;
                  fVar99 = fVar74 * -0.6931472 + auVar85._4_4_;
                  fVar101 = fVar100 * -0.6931472 + auVar85._8_4_;
                  fVar89 = fVar102 * -0.6931472 + auVar85._12_4_;
                  auVar94._0_4_ =
                       (float)((int)fVar66 * 0x800000 + (int)fVar62) *
                       (fVar90 + fVar62 +
                       (((((fVar90 * 0.00019875691 + 0.0013981999) * fVar90 + 0.008333452) * fVar90
                         + 0.041665796) * fVar90 + 0.16666666) * fVar90 + 0.5) * fVar90 * fVar90) +
                       fVar62;
                  auVar94._4_4_ =
                       (float)((int)fVar74 * 0x800000 + (int)auVar95._0_4_) *
                       (fVar99 + auVar95._0_4_ +
                       (((((fVar99 * 0.00019875691 + 0.0013981999) * fVar99 + 0.008333452) * fVar99
                         + 0.041665796) * fVar99 + 0.16666666) * fVar99 + 0.5) * fVar99 * fVar99) +
                       auVar95._0_4_;
                  auVar94._8_4_ =
                       (float)((int)fVar100 * 0x800000 + (int)fVar65) *
                       (fVar101 + fVar65 +
                       (((((fVar101 * 0.00019875691 + 0.0013981999) * fVar101 + 0.008333452) *
                          fVar101 + 0.041665796) * fVar101 + 0.16666666) * fVar101 + 0.5) *
                       fVar101 * fVar101) + fVar65;
                  auVar94._12_4_ =
                       (float)((int)fVar102 * 0x800000 + (int)fVar75) *
                       (fVar89 + fVar75 +
                       (((((fVar89 * 0.00019875691 + 0.0013981999) * fVar89 + 0.008333452) * fVar89
                         + 0.041665796) * fVar89 + 0.16666666) * fVar89 + 0.5) * fVar89 * fVar89) +
                       fVar75;
                  auVar87 = divps(auVar64,auVar94);
                  break;
                case 5:
                  auVar59 = minps(auVar87,auVar63);
                  auVar67 = maxps(auVar59,auVar67);
                  fVar99 = auVar67._0_4_ * 1.442695 + 0.5;
                  fVar100 = auVar67._4_4_ * 1.442695 + 0.5;
                  fVar101 = auVar67._8_4_ * 1.442695 + 0.5;
                  fVar102 = auVar67._12_4_ * 1.442695 + 0.5;
                  fVar89 = (float)(int)fVar99;
                  fVar96 = (float)(int)fVar100;
                  fVar97 = (float)(int)fVar101;
                  fVar98 = (float)(int)fVar102;
                  fVar89 = fVar89 - (float)(-(uint)(fVar99 < fVar89) & (uint)fVar62);
                  fVar96 = fVar96 - (float)(-(uint)(fVar100 < fVar96) & (uint)auVar95._0_4_);
                  fVar97 = fVar97 - (float)(-(uint)(fVar101 < fVar97) & (uint)fVar65);
                  fVar98 = fVar98 - (float)(-(uint)(fVar102 < fVar98) & (uint)fVar75);
                  fVar99 = auVar67._0_4_ - fVar89 * 0.6931472;
                  fVar100 = auVar67._4_4_ - fVar96 * 0.6931472;
                  fVar101 = auVar67._8_4_ - fVar97 * 0.6931472;
                  fVar102 = auVar67._12_4_ - fVar98 * 0.6931472;
                  auVar104._0_4_ =
                       (float)((int)fVar89 * 0x800000 + (int)fVar62) *
                       (fVar99 + fVar62 +
                       (((((fVar99 * 0.00019875691 + 0.0013981999) * fVar99 + 0.008333452) * fVar99
                         + 0.041665796) * fVar99 + 0.16666666) * fVar99 + 0.5) * fVar99 * fVar99) +
                       fVar62;
                  auVar104._4_4_ =
                       (float)((int)fVar96 * 0x800000 + (int)auVar95._0_4_) *
                       (fVar100 + auVar95._0_4_ +
                       (((((fVar100 * 0.00019875691 + 0.0013981999) * fVar100 + 0.008333452) *
                          fVar100 + 0.041665796) * fVar100 + 0.16666666) * fVar100 + 0.5) *
                       fVar100 * fVar100) + auVar95._0_4_;
                  auVar104._8_4_ =
                       (float)((int)fVar97 * 0x800000 + (int)fVar65) *
                       (fVar101 + fVar65 +
                       (((((fVar101 * 0.00019875691 + 0.0013981999) * fVar101 + 0.008333452) *
                          fVar101 + 0.041665796) * fVar101 + 0.16666666) * fVar101 + 0.5) *
                       fVar101 * fVar101) + fVar65;
                  auVar104._12_4_ =
                       (float)((int)fVar98 * 0x800000 + (int)fVar75) *
                       (fVar102 + fVar75 +
                       (((((fVar102 * 0.00019875691 + 0.0013981999) * fVar102 + 0.008333452) *
                          fVar102 + 0.041665796) * fVar102 + 0.16666666) * fVar102 + 0.5) *
                       fVar102 * fVar102) + fVar75;
                  auVar67 = maxps(auVar104,_DAT_005e2fd0);
                  fVar99 = (float)(auVar67._0_4_ & 0x807fffff | 0x3f000000);
                  fVar101 = (float)(auVar67._4_4_ & 0x807fffff | 0x3f000000);
                  fVar89 = (float)(auVar67._8_4_ & 0x807fffff | 0x3f000000);
                  fVar97 = (float)(auVar67._12_4_ & 0x807fffff | 0x3f000000);
                  fVar100 = fVar99 + -1.0 + (float)(-(uint)(fVar99 < 0.70710677) & (uint)fVar99);
                  fVar102 = fVar101 + -1.0 + (float)(-(uint)(fVar101 < 0.70710677) & (uint)fVar101);
                  fVar96 = fVar89 + -1.0 + (float)(-(uint)(fVar89 < 0.70710677) & (uint)fVar89);
                  fVar98 = fVar97 + -1.0 + (float)(-(uint)(fVar97 < 0.70710677) & (uint)fVar97);
                  auVar78._0_4_ =
                       ~-(uint)(auVar104._0_4_ <= 0.0) &
                       (uint)((((float)(int)((auVar67._0_4_ >> 0x17) - 0x7e) -
                               (float)(-(uint)(fVar99 < 0.70710677) & (uint)fVar62)) * 0.6931472 +
                               fVar100 +
                              (((((((((fVar100 * 0.070376836 + -0.1151461) * fVar100 + 0.116769984)
                                     * fVar100 + -0.12420141) * fVar100 + 0.14249323) * fVar100 +
                                  -0.16668057) * fVar100 + 0.20000714) * fVar100 + -0.24999994) *
                                fVar100 + 0.3333333) * fVar100 + -0.5) * fVar100 * fVar100) * -2.0);
                  auVar78._4_4_ =
                       ~-(uint)(auVar104._4_4_ <= 0.0) &
                       (uint)((((float)(int)((auVar67._4_4_ >> 0x17) - 0x7e) -
                               (float)(-(uint)(fVar101 < 0.70710677) & (uint)auVar95._0_4_)) *
                               0.6931472 + fVar102 +
                              (((((((((fVar102 * 0.070376836 + -0.1151461) * fVar102 + 0.116769984)
                                     * fVar102 + -0.12420141) * fVar102 + 0.14249323) * fVar102 +
                                  -0.16668057) * fVar102 + 0.20000714) * fVar102 + -0.24999994) *
                                fVar102 + 0.3333333) * fVar102 + -0.5) * fVar102 * fVar102) * -2.0);
                  auVar78._8_4_ =
                       ~-(uint)(auVar104._8_4_ <= 0.0) &
                       (uint)((((float)(int)((auVar67._8_4_ >> 0x17) - 0x7e) -
                               (float)(-(uint)(fVar89 < 0.70710677) & (uint)fVar65)) * 0.6931472 +
                               fVar96 + (((((((((fVar96 * 0.070376836 + -0.1151461) * fVar96 +
                                               0.116769984) * fVar96 + -0.12420141) * fVar96 +
                                             0.14249323) * fVar96 + -0.16668057) * fVar96 +
                                           0.20000714) * fVar96 + -0.24999994) * fVar96 + 0.3333333)
                                         * fVar96 + -0.5) * fVar96 * fVar96) * -2.0);
                  auVar78._12_4_ =
                       ~-(uint)(auVar104._12_4_ <= 0.0) &
                       (uint)((((float)(int)((auVar67._12_4_ >> 0x17) - 0x7e) -
                               (float)(-(uint)(fVar97 < 0.70710677) & (uint)fVar75)) * 0.6931472 +
                               fVar98 + (((((((((fVar98 * 0.070376836 + -0.1151461) * fVar98 +
                                               0.116769984) * fVar98 + -0.12420141) * fVar98 +
                                             0.14249323) * fVar98 + -0.16668057) * fVar98 +
                                           0.20000714) * fVar98 + -0.24999994) * fVar98 + 0.3333333)
                                         * fVar98 + -0.5) * fVar98 * fVar98) * -2.0);
                  auVar70._0_8_ =
                       CONCAT44(-(uint)(auVar104._4_4_ <= 0.0),-(uint)(auVar104._0_4_ <= 0.0)) &
                       0x7fffffff7fffffff;
                  auVar70._8_4_ = -(uint)(auVar104._8_4_ <= 0.0) & 0x7fffffff;
                  auVar70._12_4_ = -(uint)(auVar104._12_4_ <= 0.0) & 0x7fffffff;
                  auVar67 = minps(auVar70 | auVar78,auVar63);
                  auVar67 = maxps(auVar67,_DAT_005e2f30);
                  fVar99 = auVar67._0_4_ * 1.442695 + 0.5;
                  fVar100 = auVar67._4_4_ * 1.442695 + 0.5;
                  fVar101 = auVar67._8_4_ * 1.442695 + 0.5;
                  fVar102 = auVar67._12_4_ * 1.442695 + 0.5;
                  fVar89 = (float)(int)fVar99;
                  fVar96 = (float)(int)fVar100;
                  fVar97 = (float)(int)fVar101;
                  fVar98 = (float)(int)fVar102;
                  fVar89 = fVar89 - (float)(-(uint)(fVar99 < fVar89) & (uint)fVar62);
                  fVar96 = fVar96 - (float)(-(uint)(fVar100 < fVar96) & (uint)auVar95._0_4_);
                  fVar97 = fVar97 - (float)(-(uint)(fVar101 < fVar97) & (uint)fVar65);
                  fVar98 = fVar98 - (float)(-(uint)(fVar102 < fVar98) & (uint)fVar75);
                  fVar99 = auVar67._0_4_ - fVar89 * 0.6931472;
                  fVar100 = auVar67._4_4_ - fVar96 * 0.6931472;
                  fVar101 = auVar67._8_4_ - fVar97 * 0.6931472;
                  fVar102 = auVar67._12_4_ - fVar98 * 0.6931472;
                  auVar59 = ZEXT816(0);
                  auVar79._0_4_ =
                       (float)((int)fVar89 * 0x800000 + (int)fVar62) *
                       (fVar99 + fVar62 +
                       (((((fVar99 * 0.00019875691 + 0.0013981999) * fVar99 + 0.008333452) * fVar99
                         + 0.041665796) * fVar99 + 0.16666666) * fVar99 + 0.5) * fVar99 * fVar99) +
                       fVar62;
                  auVar79._4_4_ =
                       (float)((int)fVar96 * 0x800000 + (int)auVar95._0_4_) *
                       (fVar100 + auVar95._0_4_ +
                       (((((fVar100 * 0.00019875691 + 0.0013981999) * fVar100 + 0.008333452) *
                          fVar100 + 0.041665796) * fVar100 + 0.16666666) * fVar100 + 0.5) *
                       fVar100 * fVar100) + auVar95._0_4_;
                  auVar79._8_4_ =
                       (float)((int)fVar97 * 0x800000 + (int)fVar65) *
                       (fVar101 + fVar65 +
                       (((((fVar101 * 0.00019875691 + 0.0013981999) * fVar101 + 0.008333452) *
                          fVar101 + 0.041665796) * fVar101 + 0.16666666) * fVar101 + 0.5) *
                       fVar101 * fVar101) + fVar65;
                  auVar79._12_4_ =
                       (float)((int)fVar98 * 0x800000 + (int)fVar75) *
                       (fVar102 + fVar75 +
                       (((((fVar102 * 0.00019875691 + 0.0013981999) * fVar102 + 0.008333452) *
                          fVar102 + 0.041665796) * fVar102 + 0.16666666) * fVar102 + 0.5) *
                       fVar102 * fVar102) + fVar75;
                  auVar67 = divps(_DAT_005e3bf0,auVar79);
                  auVar73._0_4_ = auVar67._0_4_ + -1.0;
                  auVar73._4_4_ = auVar67._4_4_ + -1.0;
                  auVar73._8_4_ = auVar67._8_4_ + -1.0;
                  auVar73._12_4_ = auVar67._12_4_ + -1.0;
                  auVar67 = _DAT_005e2f30;
                  goto LAB_0028d561;
                case 6:
                  pfVar52 = (float *)(this->super_Deconvolution).activation_params.data;
                  fVar75 = *pfVar52;
                  fVar99 = pfVar52[1];
                  auVar72._0_4_ = fVar75 * auVar87._0_4_ + fVar99;
                  auVar72._4_4_ = fVar75 * fVar66 + fVar99;
                  auVar72._8_4_ = fVar75 * fVar90 + fVar99;
                  auVar72._12_4_ = fVar75 * fVar74 + fVar99;
                  auVar85 = maxps(auVar72,auVar59);
                  auVar73 = minps(auVar85,auVar64);
LAB_0028d561:
                  auVar87._0_4_ = auVar87._0_4_ * auVar73._0_4_;
                  auVar87._4_4_ = fVar66 * auVar73._4_4_;
                  auVar87._8_4_ = fVar90 * auVar73._8_4_;
                  auVar87._12_4_ = fVar74 * auVar73._12_4_;
                }
                *pauVar50 = auVar87;
                pauVar50 = pauVar50 + 1;
                uVar37 = uVar37 + 1;
                iVar53 = iVar53 + 1;
              } while (uVar37 != local_1b8.w);
            }
            local_260 = local_260 + 1;
          } while (local_260 != local_1b8.h);
        }
        local_270 = local_270 + 1;
      } while (local_270 != local_1b8.c);
    }
    if ((((int)local_160 == 4) && (bVar46 != 0)) && (local_120 = (long)local_1b8.c, 0 < local_120))
    {
      iVar4 = (this->super_Deconvolution).dilation_w;
      iVar5 = (this->super_Deconvolution).dilation_h;
      iVar55 = (this->super_Deconvolution).stride_w;
      iVar48 = (this->super_Deconvolution).stride_h;
      iVar22 = (this->super_Deconvolution).activation_type;
      pvVar8 = (this->super_Deconvolution).bias_data.data;
      uVar47 = (this->super_Deconvolution).kernel_w;
      uVar34 = (this->super_Deconvolution).kernel_h;
      local_130 = local_1b8.data;
      local_80 = CONCAT44(local_1b8.elemsize._4_4_,(undefined4)local_1b8.elemsize) * local_1b8.cstep
      ;
      iVar49 = bottom_blob->w;
      iVar38 = bottom_blob->h;
      uVar29 = bottom_blob->c;
      local_270 = 0;
      do {
        if (0 < iVar35) {
          local_228 = (float *)(local_80 * local_270 + (long)local_130);
          local_168 = (void *)((this->weight_data_tm).cstep * local_270 *
                               (this->weight_data_tm).elemsize + (long)(this->weight_data_tm).data);
          iVar53 = 0;
          do {
            if (0 < iVar33) {
              iVar25 = bottom_blob->w;
              pvVar56 = bottom_blob->data;
              sVar9 = bottom_blob->elemsize;
              sVar7 = bottom_blob->cstep;
              pfVar52 = (float *)(this->super_Deconvolution).activation_params.data;
              uVar37 = 0;
              iVar24 = (1 - uVar47) * iVar4;
              do {
                if (pvVar8 == (void *)0x0) {
                  fVar62 = 0.0;
                }
                else {
                  fVar62 = *(float *)((long)pvVar8 + local_270 * 4);
                }
                if ((int)uVar29 < 1) {
                  auVar64 = ZEXT816(0);
                }
                else {
                  auVar64 = ZEXT816(0);
                  uVar36 = 0;
                  pvVar58 = local_168;
                  do {
                    local_158._0_8_ = uVar36;
                    if (0 < (int)uVar34) {
                      uVar42 = 0;
                      uVar45 = 0;
                      do {
                        iVar26 = (((int)uVar45 - uVar34) + 1) * iVar5 + iVar53;
                        if ((((-1 < iVar26) && (iVar27 = iVar26 / iVar48, iVar26 % iVar48 == 0)) &&
                            (0 < (int)uVar47)) && (iVar27 < iVar38)) {
                          uVar44 = (ulong)uVar47;
                          uVar54 = uVar42;
                          auVar63 = auVar64;
                          iVar26 = iVar24;
                          do {
                            auVar64 = auVar63;
                            if (((-1 < iVar26) && (iVar28 = iVar26 / iVar55, iVar26 % iVar55 == 0))
                               && (iVar28 < iVar49)) {
                              pfVar40 = (float *)((long)pvVar58 + (uVar54 & 0xffffffff) * 4);
                              pfVar1 = (float *)((long)pvVar56 +
                                                (long)(iVar28 << 2) * 4 +
                                                (long)iVar27 * (long)iVar25 * sVar9 +
                                                sVar7 * sVar9 * uVar36);
                              auVar64._0_4_ = auVar63._0_4_ + *pfVar40 * *pfVar1;
                              auVar64._4_4_ = auVar63._4_4_ + pfVar40[1] * pfVar1[1];
                              auVar64._8_4_ = auVar63._8_4_ + pfVar40[2] * pfVar1[2];
                              auVar64._12_4_ = auVar63._12_4_ + pfVar40[3] * pfVar1[3];
                            }
                            uVar54 = uVar54 + 4;
                            iVar26 = iVar26 + iVar4;
                            uVar44 = uVar44 - 1;
                            auVar63 = auVar64;
                          } while (uVar44 != 0);
                        }
                        uVar45 = uVar45 + 1;
                        uVar42 = uVar42 + (ulong)uVar47 * 4;
                      } while (uVar45 != uVar34);
                    }
                    pvVar58 = (void *)((long)pvVar58 + (long)(int)(uVar47 * uVar34 * 4) * 4);
                    uVar36 = uVar36 + 1;
                  } while (uVar36 != uVar29);
                }
                auVar81._4_4_ = auVar64._12_4_ + auVar64._4_4_;
                auVar81._0_4_ = auVar81._4_4_;
                auVar81._8_4_ = auVar81._4_4_;
                auVar81._12_4_ = auVar81._4_4_;
                auVar95._4_12_ = auVar81._4_12_;
                auVar95._0_4_ = auVar81._4_4_ + fVar62 + auVar64._8_4_ + auVar64._0_4_;
                fVar62 = auVar95._0_4_;
                switch(iVar22) {
                case 1:
                  if (auVar95._0_4_ <= 0.0) {
                    auVar11._12_4_ = 0;
                    auVar11._0_12_ = auVar95._4_12_;
                    auVar95 = auVar11 << 0x20;
                  }
LAB_0028d8ee:
                  fVar62 = auVar95._0_4_;
                  break;
                case 2:
                  fVar62 = (float)(~-(uint)(0.0 < auVar95._0_4_) & (uint)*pfVar52 |
                                  -(uint)(0.0 < auVar95._0_4_) & 0x3f800000) * auVar95._0_4_;
                  break;
                case 3:
                  if (auVar95._0_4_ <= *pfVar52) {
                    auVar95._0_4_ = *pfVar52;
                  }
                  fVar62 = auVar95._0_4_;
                  if (pfVar52[1] < auVar95._0_4_) {
                    fVar62 = pfVar52[1];
                  }
                  break;
                case 4:
                  if (88.37626 <= auVar95._0_4_) {
                    auVar95._0_4_ = 88.37626;
                  }
                  fVar62 = expf((float)(-(uint)(auVar95._0_4_ < -88.37626) & 0x42b0c0a5 |
                                       ~-(uint)(auVar95._0_4_ < -88.37626) & (uint)-auVar95._0_4_));
                  fVar62 = 1.0 / (fVar62 + 1.0);
                  break;
                case 5:
                  local_158 = auVar95;
                  fVar62 = expf(auVar95._0_4_);
                  fVar62 = logf(fVar62 + 1.0);
                  fVar62 = tanhf(fVar62);
                  fVar62 = fVar62 * (float)local_158._0_4_;
                  break;
                case 6:
                  fVar65 = *pfVar52;
                  fVar75 = -pfVar52[1] / fVar65;
                  fVar62 = 0.0;
                  if (fVar75 <= auVar95._0_4_) {
                    if (fVar75 + 1.0 / fVar65 < auVar95._0_4_) goto LAB_0028d8ee;
                    fVar62 = (fVar65 * auVar95._0_4_ + pfVar52[1]) * auVar95._0_4_;
                  }
                }
                *local_228 = fVar62;
                local_228 = local_228 + 1;
                uVar37 = uVar37 + 1;
                iVar24 = iVar24 + 1;
              } while (uVar37 != iVar33);
            }
            iVar53 = iVar53 + 1;
          } while (iVar53 != iVar35);
        }
        local_270 = local_270 + 1;
      } while (local_270 != local_120);
    }
    auVar63 = local_158;
    iVar5 = local_1b8.h;
    iVar4 = local_1b8.w;
    if ((bVar46 == 1 && (int)local_160 == 1) &&
       (lVar43 = (long)(this->super_Deconvolution).num_output, 0 < lVar43)) {
      local_160 = local_1b8.data;
      local_130 = (void *)(local_1b8.cstep *
                          CONCAT44(local_1b8.elemsize._4_4_,(undefined4)local_1b8.elemsize));
      iVar33 = bottom_blob->w;
      iVar35 = bottom_blob->h;
      local_158._4_4_ = 0;
      local_158._0_4_ = bottom_blob->c;
      local_158._8_8_ = auVar63._8_8_;
      uVar36 = (ulong)(uint)local_1b8.w;
      local_120 = (long)local_1b8.w;
      local_270 = 0;
      do {
        if (0 < iVar5) {
          local_280 = (void *)((long)local_130 * local_270 + (long)local_160);
          iVar55 = (this->super_Deconvolution).bias_term;
          iVar48 = (this->super_Deconvolution).activation_type;
          local_168 = (void *)((this->weight_data_tm).cstep * (this->weight_data_tm).elemsize *
                               local_270 + (long)(this->weight_data_tm).data);
          local_274 = 0;
          do {
            if (0 < iVar4) {
              pvVar8 = (this->super_Deconvolution).bias_data.data;
              iVar49 = bottom_blob->w;
              pvVar56 = bottom_blob->data;
              sVar9 = bottom_blob->elemsize;
              sVar7 = bottom_blob->cstep;
              uVar47 = (this->super_Deconvolution).kernel_h;
              iVar38 = local_274 - local_134;
              pfVar52 = (float *)(this->super_Deconvolution).activation_params.data;
              uVar42 = 0;
              iVar22 = -iVar23;
              do {
                if (iVar55 == 0) {
                  auVar80 = ZEXT812(0);
                }
                else {
                  auVar80._4_8_ = 0;
                  auVar80._0_4_ = *(uint *)((long)pvVar8 + local_270 * 4);
                }
                auVar82._12_4_ = 0;
                auVar82._0_12_ = auVar80;
                if (0 < (int)local_158._0_4_) {
                  iVar53 = (this->super_Deconvolution).stride_h;
                  uVar34 = (this->super_Deconvolution).kernel_w;
                  iVar24 = (this->super_Deconvolution).stride_w;
                  lVar31 = 0;
                  pvVar58 = local_168;
                  do {
                    if (0 < (int)uVar47) {
                      uVar45 = 0;
                      pvVar57 = pvVar58;
                      do {
                        iVar25 = (this->super_Deconvolution).dilation_h * (int)uVar45 + iVar38;
                        if ((((-1 < iVar25) && (iVar26 = iVar25 / iVar53, iVar25 % iVar53 == 0)) &&
                            (iVar26 < iVar35)) && (0 < (int)uVar34)) {
                          uVar44 = 0;
                          iVar25 = iVar22;
                          do {
                            if (((-1 < iVar25) && (iVar27 = iVar25 / iVar24, iVar25 % iVar24 == 0))
                               && (iVar27 < iVar33)) {
                              auVar82._0_4_ =
                                   auVar82._0_4_ +
                                   *(float *)((long)pvVar57 + uVar44 * 4) *
                                   *(float *)((long)pvVar56 +
                                             (long)iVar27 * 4 +
                                             (long)iVar26 * (long)iVar49 * sVar9 +
                                             sVar7 * sVar9 * lVar31);
                            }
                            uVar44 = uVar44 + 1;
                            iVar25 = iVar25 + (this->super_Deconvolution).dilation_w;
                          } while (uVar34 != uVar44);
                        }
                        uVar45 = uVar45 + 1;
                        pvVar57 = (void *)((long)pvVar57 + (ulong)uVar34 * 4);
                      } while (uVar45 != uVar47);
                    }
                    lVar31 = lVar31 + 1;
                    pvVar58 = (void *)((long)pvVar58 + (long)iVar51 * 4);
                  } while (lVar31 != local_158._0_8_);
                }
                fVar62 = auVar82._0_4_;
                auVar60 = auVar82;
                switch(iVar48) {
                case 1:
                  if (fVar62 <= 0.0) {
                    auVar12._12_4_ = 0;
                    auVar12._0_12_ = auVar82._4_12_;
                    auVar60 = auVar12 << 0x20;
                  }
                  break;
                case 2:
                  auVar60 = ZEXT416((uint)((float)(~-(uint)(0.0 < fVar62) & (uint)*pfVar52 |
                                                  -(uint)(0.0 < fVar62) & 0x3f800000) * fVar62));
                  break;
                case 3:
                  if (fVar62 <= *pfVar52) {
                    auVar82._0_4_ = *pfVar52;
                  }
                  fVar62 = pfVar52[1];
                  auVar60 = auVar82;
                  if (fVar62 < auVar82._0_4_) {
LAB_0028dea9:
                    auVar60 = ZEXT416((uint)fVar62);
                  }
                  break;
                case 4:
                  if (88.37626 <= fVar62) {
                    fVar62 = 88.37626;
                  }
                  fVar62 = expf((float)(-(uint)(fVar62 < -88.37626) & 0x42b0c0a5 |
                                       ~-(uint)(fVar62 < -88.37626) & (uint)-fVar62));
                  auVar60 = ZEXT416((uint)(1.0 / (fVar62 + 1.0)));
                  break;
                case 5:
                  auVar95._0_4_ = expf(fVar62);
                  auVar95._0_4_ = logf(auVar95._0_4_ + 1.0);
                  auVar95._0_4_ = tanhf(auVar95._0_4_);
                  auVar60._0_4_ = auVar95._0_4_ * fVar62;
                  auVar60._4_12_ = extraout_var;
                  break;
                case 6:
                  auVar95._0_4_ = *pfVar52;
                  fVar65 = -pfVar52[1] / auVar95._0_4_;
                  auVar60 = ZEXT816(0);
                  if ((fVar65 <= fVar62) &&
                     (auVar60 = auVar82, fVar62 <= fVar65 + 1.0 / auVar95._0_4_)) {
                    fVar62 = (auVar95._0_4_ * fVar62 + pfVar52[1]) * fVar62;
                    goto LAB_0028dea9;
                  }
                }
                *(int *)((long)local_280 + uVar42 * 4) = auVar60._0_4_;
                uVar42 = uVar42 + 1;
                iVar22 = iVar22 + 1;
              } while (uVar42 != uVar36);
            }
            local_280 = (void *)((long)local_280 + local_120 * 4);
            local_274 = local_274 + 1;
          } while (local_274 != iVar5);
        }
        local_270 = local_270 + 1;
      } while (local_270 != lVar43);
    }
  }
  pMVar21 = local_128;
  Deconvolution::cut_padding(&this->super_Deconvolution,&local_1b8,local_128,local_140);
  iVar23 = -100;
  if ((pMVar21->data != (void *)0x0) && (iVar23 = -100, (long)pMVar21->c * pMVar21->cstep != 0)) {
    iVar23 = 0;
  }
LAB_0028e699:
  piVar6 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if (local_1b8.allocator == (Allocator *)0x0) {
        if (local_1b8.data != (void *)0x0) {
          free(local_1b8.data);
        }
      }
      else {
        (**(code **)(*(long *)local_1b8.allocator + 0x18))();
      }
    }
  }
  return iVar23;
}

Assistant:

int Deconvolution_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // deconvolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    //     NCNN_LOGE("Deconvolution input %d x %d  pad = %d %d  ksize=%d %d  stride=%d %d", w, h, pad_w, pad_h, kernel_w, kernel_h, stride_w, stride_h);

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;
    int outh = (h - 1) * stride_h + kernel_extent_h + output_pad_bottom;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    int out_channels = num_output / out_elempack;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0 || (output_w > 0 && output_h > 0))
    {
        top_blob_bordered.create(outw, outh, out_channels, out_elemsize, out_elempack, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, out_channels, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    if (opt.use_sgemm_convolution)
    {
        // sgemm
        Mat bottom_blob_2 = bottom_blob;
        {
            bottom_blob_2.w = bottom_blob.w * bottom_blob.h;
            bottom_blob_2.h = 1;
        }
        Mat top_col2im;
        Option opt_b = opt;
        opt_b.blob_allocator = top_blob_bordered.allocator;
        int ret = gemm->forward(bottom_blob_2, top_col2im, opt_b);
        if (ret != 0)
            return ret;

        {
            // col2im
            const int gap = (outw * stride_h - w * stride_w) * out_elempack;

#if __SSE2__
#if __AVX__
#if __AVX512F__
            if (out_elempack == 16)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p = 0; p < out_channels; p++)
                {
                    const float* sptr = top_col2im.row(p * maxk);
                    Mat outm = top_blob_bordered.channel(p);

                    if (bias_data.empty())
                    {
                        outm.fill(_mm512_setzero_ps());
                    }
                    else
                    {
                        outm.fill(_mm512_loadu_ps((const float*)bias_data + p * 16));
                    }

                    for (int u = 0; u < kernel_h; u++)
                    {
                        for (int v = 0; v < kernel_w; v++)
                        {
                            float* ptr = outm.row(dilation_h * u) + dilation_w * v * 16;

                            for (int i = 0; i < h; i++)
                            {
                                for (int j = 0; j < w; j++)
                                {
                                    __m512 _val = _mm512_load_ps(ptr);
                                    __m512 _s = _mm512_load_ps(sptr);
                                    _val = _mm512_add_ps(_val, _s);
                                    _mm512_store_ps(ptr, _val);

                                    ptr += stride_w * 16;
                                    sptr += 16;
                                }

                                ptr += gap;
                            }
                        }
                    }
                }
            }
#endif // __AVX512F__

            if (out_elempack == 8)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p = 0; p < out_channels; p++)
                {
                    const float* sptr = top_col2im.row(p * maxk);
                    Mat outm = top_blob_bordered.channel(p);

                    if (bias_data.empty())
                    {
                        outm.fill(_mm256_setzero_ps());
                    }
                    else
                    {
                        outm.fill(_mm256_loadu_ps((const float*)bias_data + p * 8));
                    }

                    for (int u = 0; u < kernel_h; u++)
                    {
                        for (int v = 0; v < kernel_w; v++)
                        {
                            float* ptr = outm.row(dilation_h * u) + dilation_w * v * 8;

                            for (int i = 0; i < h; i++)
                            {
                                for (int j = 0; j < w; j++)
                                {
                                    __m256 _val = _mm256_load_ps(ptr);
                                    __m256 _s = _mm256_load_ps(sptr);
                                    _val = _mm256_add_ps(_val, _s);
                                    _mm256_store_ps(ptr, _val);

                                    ptr += stride_w * 8;
                                    sptr += 8;
                                }

                                ptr += gap;
                            }
                        }
                    }
                }
            }
#endif // __AVX__

            if (out_elempack == 4)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p = 0; p < out_channels; p++)
                {
                    const float* sptr = top_col2im.row(p * maxk);
                    Mat outm = top_blob_bordered.channel(p);

                    if (bias_data.empty())
                    {
                        outm.fill(_mm_setzero_ps());
                    }
                    else
                    {
                        outm.fill(_mm_loadu_ps((const float*)bias_data + p * 4));
                    }

                    for (int u = 0; u < kernel_h; u++)
                    {
                        for (int v = 0; v < kernel_w; v++)
                        {
                            float* ptr = outm.row(dilation_h * u) + dilation_w * v * 4;

                            for (int i = 0; i < h; i++)
                            {
                                for (int j = 0; j < w; j++)
                                {
                                    __m128 _val = _mm_load_ps(ptr);
                                    __m128 _s = _mm_load_ps(sptr);
                                    _val = _mm_add_ps(_val, _s);
                                    _mm_store_ps(ptr, _val);

                                    ptr += stride_w * 4;
                                    sptr += 4;
                                }

                                ptr += gap;
                            }
                        }
                    }
                }
            }
#endif // __SSE2__

            if (out_elempack == 1)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p = 0; p < out_channels; p++)
                {
                    const float* sptr = top_col2im.row(p * maxk);
                    Mat outm = top_blob_bordered.channel(p);

                    const float bias = bias_data.empty() ? 0.f : bias_data[p];
                    outm.fill(bias);

                    for (int u = 0; u < kernel_h; u++)
                    {
                        for (int v = 0; v < kernel_w; v++)
                        {
                            float* ptr = outm.row(dilation_h * u) + dilation_w * v;

                            for (int i = 0; i < h; i++)
                            {
                                for (int j = 0; j < w; j++)
                                {
                                    ptr[0] += sptr[0];

                                    ptr += stride_w;
                                    sptr += 1;
                                }

                                ptr += gap;
                            }
                        }
                    }
                }
            }
        }

        if (activation)
        {
            activation->forward_inplace(top_blob_bordered, opt);
        }
    }
    else
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16 && out_elempack == 16)
        {
            deconvolution_pack16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 8 && out_elempack == 16)
        {
            deconvolution_pack8to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 16 && out_elempack == 8)
        {
            deconvolution_pack16to8_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 4 && out_elempack == 16)
        {
            deconvolution_pack4to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 16 && out_elempack == 4)
        {
            deconvolution_pack16to4_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 1 && out_elempack == 16)
        {
            deconvolution_pack1to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 16 && out_elempack == 1)
        {
            deconvolution_pack16to1_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
#endif // __AVX512F__

        if (elempack == 8 && out_elempack == 8)
        {
            deconvolution_pack8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 4 && out_elempack == 8)
        {
            deconvolution_pack4to8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 8 && out_elempack == 4)
        {
            deconvolution_pack8to4_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 1 && out_elempack == 8)
        {
            deconvolution_pack1to8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 8 && out_elempack == 1)
        {
            deconvolution_pack8to1_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
#endif // __AVX__

        if (elempack == 4 && out_elempack == 4)
        {
            deconvolution_pack4_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 1 && out_elempack == 4)
        {
            deconvolution_pack1to4_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 4 && out_elempack == 1)
        {
            deconvolution_pack4to1_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
#endif // __SSE2__

        if (elempack == 1 && out_elempack == 1)
        {
            // num_output
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < num_output; p++)
            {
                float* outptr = top_blob_bordered.channel(p);

                // shadowed variable for less openmp task args
                const int w = bottom_blob.w;
                const int h = bottom_blob.h;
                const int channels = bottom_blob.c;
                const int outw = top_blob_bordered.w;
                const int outh = top_blob_bordered.h;

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        float sum = 0.f;

                        if (bias_term)
                        {
                            sum = bias_data[p];
                        }

                        const float* kptr = (const float*)weight_data_tm.channel(p);

                        // channels
                        for (int q = 0; q < channels; q++)
                        {
                            const Mat m = bottom_blob.channel(q);

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                const float* sptr = m.row(sy);

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    float val = sptr[sx];

                                    int k = y * kernel_w + x;

                                    float w = kptr[k];

                                    sum += val * w;
                                }
                            }

                            kptr += maxk;
                        }

                        sum = activation_ss(sum, activation_type, activation_params);

                        outptr[j] = sum;
                    }

                    outptr += outw;
                }
            }
        }
    }

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}